

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<int,_std::allocator<int>_> *variable,string *value)

{
  long lVar1;
  int local_14;
  char *res;
  
  res = (char *)0x0;
  lVar1 = strtol((value->_M_dataplus)._M_p,&res,10);
  local_14 = (int)lVar1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(variable,&local_14);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<int>* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  variable->push_back(static_cast<int>(strtol(value.c_str(), &res, 10)));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}